

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint _elempack;
  int iVar9;
  Layer *pLVar10;
  undefined4 *puVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  ulong uVar16;
  int _w;
  ulong uVar17;
  bool bVar18;
  ParamDict pd;
  size_t local_68;
  Allocator *local_58;
  int local_4c;
  
  pLVar10 = create_layer(0xe);
  this->flatten = pLVar10;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_avx[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar9 = cpu_support_x86_f16c();
  if ((iVar9 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  p_Var1 = this->_vptr_InnerProduct_x86_avx[-3];
  _h = *(uint *)(&this->field_0xd0 + (long)p_Var1);
  iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var1);
  uVar17 = (long)iVar9 / (long)(int)_h;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      _elempack = 8;
    }
    else {
      if ((_h & 3) != 0) goto LAB_002e9638;
      _elempack = 4;
    }
    uVar16 = 0;
    _w = (int)uVar17;
    Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x130 + (long)p_Var1),_w,_h,(Allocator *)0x0);
    Mat::create(&this->weight_data_tm,_w,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
                (int)_elempack,(ulong)(_elempack * 4),_elempack,(Allocator *)0x0);
    pp_Var5 = this->_vptr_InnerProduct_x86_avx;
    pvVar3 = (this->weight_data_tm).data;
    iVar9 = (this->weight_data_tm).w;
    sVar6 = (this->weight_data_tm).elemsize;
    uVar17 = uVar17 & 0xffffffff;
    if (_w < 1) {
      uVar17 = uVar16;
    }
    for (; (long)((_elempack - 1) + uVar16) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]);
        uVar16 = uVar16 + _elempack) {
      puVar11 = (undefined4 *)
                (((uVar16 & 0xffffffff) / (ulong)_elempack) * (long)iVar9 * sVar6 + (long)pvVar3);
      pp_Var14 = (_func_int **)((long)local_4c * local_68 * uVar16 + (long)pd._vptr_ParamDict);
      for (uVar15 = 0; pp_Var12 = pp_Var14, uVar13 = (ulong)_elempack, uVar15 != uVar17;
          uVar15 = uVar15 + 1) {
        while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
          *puVar11 = *(undefined4 *)pp_Var12;
          puVar11 = puVar11 + 1;
          pp_Var12 = (_func_int **)((long)pp_Var12 + (long)local_4c * local_68);
        }
        pp_Var14 = (_func_int **)((long)pp_Var14 + 4);
      }
    }
    if (pd.d != (ParamDictPrivate *)0x0) {
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
LAB_002e9638:
    if (p_Var1 != (_func_int *)0xfffffffffffffee0) {
      piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            free(pvVar3);
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)iVar9 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      piVar2 = *(int **)((long)(&this->field_0x130 + (long)p_Var1) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var1);
      (this->weight_data_tm).refcount = piVar2;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var1);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var1);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var1);
      uVar7 = *(undefined8 *)(&this->field_0x158 + (long)p_Var1);
      uVar8 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var1) + 8);
      (this->weight_data_tm).dims = (int)uVar7;
      (this->weight_data_tm).w = (int)((ulong)uVar7 >> 0x20);
      (this->weight_data_tm).h = (int)uVar8;
      (this->weight_data_tm).d = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var1);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var1);
    }
  }
  if (opt->lightmode == true) {
    p_Var1 = this->_vptr_InnerProduct_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var1));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}